

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::convertTextData<unsigned_long>
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_long *source,
          char *pointerToStore,int sizeWithoutHeader)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  unsigned_short *puVar5;
  int local_3c;
  int i;
  unsigned_long cc;
  size_t numShift;
  int sizeWithoutHeader_local;
  char *pointerToStore_local;
  unsigned_long *source_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  bVar2 = isLittleEndian(this,this->TargetFormat);
  bVar3 = isLittleEndian(this,this->SourceFormat);
  if (bVar2 != bVar3) {
    convertToLittleEndian<unsigned_long>(this,source);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)sizeWithoutHeader;
  uVar4 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (unsigned_short *)operator_new__(uVar4);
  this->TextData = puVar5;
  for (local_3c = 0; local_3c < sizeWithoutHeader; local_3c = local_3c + 1) {
    this->TextData[local_3c] = (unsigned_short)source[local_3c];
  }
  this->TextBegin = this->TextData;
  this->TextSize = sizeWithoutHeader;
  if (pointerToStore != (char *)0x0) {
    operator_delete__(pointerToStore);
  }
  return;
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}